

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O2

CoinSelectionParams *
wallet::group_outputs_tests::makeSelectionParams
          (CoinSelectionParams *__return_storage_ptr__,FastRandomContext *rand,
          bool avoid_partial_spends)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->rng_fast = rand;
  __return_storage_ptr__->change_output_size = 0;
  __return_storage_ptr__->change_spend_size = 0;
  __return_storage_ptr__->m_min_change_target = 1000000;
  __return_storage_ptr__->min_viable_change = 0;
  __return_storage_ptr__->m_change_fee = 0;
  __return_storage_ptr__->m_cost_of_change = 0;
  (__return_storage_ptr__->m_effective_feerate).nSatoshisPerK = 0;
  (__return_storage_ptr__->m_long_term_feerate).nSatoshisPerK = 0;
  (__return_storage_ptr__->m_discard_feerate).nSatoshisPerK = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_discard_feerate).nSatoshisPerK + 5) = 0;
  __return_storage_ptr__->m_avoid_partial_spends = avoid_partial_spends;
  __return_storage_ptr__->m_include_unsafe_inputs = false;
  (__return_storage_ptr__->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = (_Optional_payload_base<int>)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CoinSelectionParams makeSelectionParams(FastRandomContext& rand, bool avoid_partial_spends)
{
    return CoinSelectionParams{
            rand,
            /*change_output_size=*/ 0,
            /*change_spend_size=*/ 0,
            /*min_change_target=*/ CENT,
            /*effective_feerate=*/ CFeeRate(0),
            /*long_term_feerate=*/ CFeeRate(0),
            /*discard_feerate=*/ CFeeRate(0),
            /*tx_noinputs_size=*/ 0,
            /*avoid_partial=*/ avoid_partial_spends,
    };
}